

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cxx
# Opt level: O3

bool write_file(string *name,string *content,bool *append)

{
  char cVar1;
  ofstream outfile;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  std::ofstream::ofstream(&local_220);
  std::ofstream::open((char *)&local_220,(_Ios_Openmode)(name->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,(content->_M_dataplus)._M_p,content->_M_string_length);
  }
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _zmq_msg_data;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return (bool)cVar1;
}

Assistant:

bool write_file(
        const std::string &name, const std::string &content, const bool &append) {
    std::ofstream outfile;

    if (append)
        outfile.open(
                name.c_str(),
                std::ofstream::binary|
                std::ofstream::ate|
                std::ofstream::app
            );
    else
        outfile.open(name.c_str(), std::ofstream::binary);

    if (outfile.is_open()) {
        outfile << content;
        return true;
    }

    return false;
}